

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewScGenFunc(Lowerer *this,Instr *newScFuncInstr)

{
  Opnd *pOVar1;
  IntConstOpnd *functionBodySlotOpnd_00;
  RegOpnd *envOpnd_00;
  Instr *pIVar2;
  Instr *instrPrev;
  RegOpnd *envOpnd;
  IntConstOpnd *functionBodySlotOpnd;
  Instr *newScFuncInstr_local;
  Lowerer *this_local;
  
  pOVar1 = IR::Instr::UnlinkSrc1(newScFuncInstr);
  functionBodySlotOpnd_00 = IR::Opnd::AsIntConstOpnd(pOVar1);
  pOVar1 = IR::Instr::UnlinkSrc2(newScFuncInstr);
  envOpnd_00 = IR::Opnd::AsRegOpnd(pOVar1);
  pIVar2 = LoadFunctionBodyAsArgument(this,newScFuncInstr,functionBodySlotOpnd_00,envOpnd_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,newScFuncInstr,HelperScrFunc_OP_NewScGenFunc,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScGenFunc(IR::Instr * newScFuncInstr)
{
    IR::IntConstOpnd * functionBodySlotOpnd = newScFuncInstr->UnlinkSrc1()->AsIntConstOpnd();
    IR::RegOpnd * envOpnd = newScFuncInstr->UnlinkSrc2()->AsRegOpnd();

    IR::Instr * instrPrev = this->LoadFunctionBodyAsArgument(newScFuncInstr, functionBodySlotOpnd, envOpnd);
    m_lowererMD.ChangeToHelperCall(newScFuncInstr, IR::HelperScrFunc_OP_NewScGenFunc );

    return instrPrev;
}